

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QSQLiteResult_*>::begin(QList<QSQLiteResult_*> *this)

{
  QSQLiteResult **n;
  QArrayDataPointer<QSQLiteResult_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QSQLiteResult_*> *)0x1280f9);
  QArrayDataPointer<QSQLiteResult_*>::operator->(in_RDI);
  n = QArrayDataPointer<QSQLiteResult_*>::begin((QArrayDataPointer<QSQLiteResult_*> *)0x12810a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }